

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int multiSelectOrderBy(Parse *pParse,Select *p,SelectDest *pDest)

{
  u8 uVar1;
  int iVar2;
  sqlite3 *db_00;
  Vdbe *p_00;
  Select *pSelect;
  bool bVar3;
  LogEst LVar4;
  int iBreak;
  int iDest;
  int iParm;
  int iParm_00;
  int regReturn;
  int regReturn_00;
  int iVar5;
  int addr;
  Expr *pExpr;
  int *zP4;
  ExprList *pEVar6;
  CollSeq *pCVar7;
  int local_13c;
  ExprList_item *pEStack_128;
  int nExpr;
  ExprList_item *pItem_1;
  Expr *pNew;
  ExprList_item *pItem;
  int *aPermute;
  ExprList *pEStack_100;
  int nOrderBy;
  ExprList *pOrderBy;
  sqlite3 *db;
  KeyInfo *pKeyMerge;
  KeyInfo *pKeyDup;
  int op;
  int addr1;
  int labelEnd;
  int labelCmpr;
  int savedOffset;
  int savedLimit;
  int regPrev;
  int regLimitB;
  int regLimitA;
  int addrAgtB;
  int addrAeqB;
  int addrAltB;
  int addrEofB;
  int addrEofA_noB;
  int addrEofA;
  int addrOutB;
  int addrOutA;
  int regOutB;
  int regOutA;
  int addrSelectB;
  int addrSelectA;
  int regAddrB;
  int regAddrA;
  SelectDest destB;
  SelectDest destA;
  Vdbe *v;
  Select *pPrior;
  int j;
  int i;
  SelectDest *pDest_local;
  Select *p_local;
  Parse *pParse_local;
  
  addrEofA_noB = 0;
  pKeyMerge = (KeyInfo *)0x0;
  db_00 = pParse->db;
  p_00 = pParse->pVdbe;
  iBreak = sqlite3VdbeMakeLabel(pParse);
  iDest = sqlite3VdbeMakeLabel(pParse);
  uVar1 = p->op;
  pSelect = p->pPrior;
  pEStack_100 = p->pOrderBy;
  aPermute._4_4_ = pEStack_100->nExpr;
  if (uVar1 != 0x80) {
    pPrior._4_4_ = 1;
    while( true ) {
      bVar3 = false;
      if (db_00->mallocFailed == '\0') {
        bVar3 = (int)pPrior._4_4_ <= p->pEList->nExpr;
      }
      if (!bVar3) break;
      pPrior._0_4_ = 0;
      pNew = (Expr *)pEStack_100->a;
      while (((int)pPrior < aPermute._4_4_ && (*(ushort *)((long)&pNew->pRight + 4) != pPrior._4_4_)
             )) {
        pPrior._0_4_ = (int)pPrior + 1;
        pNew = (Expr *)&pNew->x;
      }
      if ((int)pPrior == aPermute._4_4_) {
        pExpr = sqlite3Expr(db_00,0x93,(char *)0x0);
        if (pExpr == (Expr *)0x0) {
          return 7;
        }
        pExpr->flags = pExpr->flags | 0x400;
        (pExpr->u).iValue = pPrior._4_4_;
        pEStack_100 = sqlite3ExprListAppend(pParse,pEStack_100,pExpr);
        p->pOrderBy = pEStack_100;
        if (pEStack_100 != (ExprList *)0x0) {
          pEStack_100->a[aPermute._4_4_].u.x.iOrderByCol = (u16)pPrior._4_4_;
          aPermute._4_4_ = aPermute._4_4_ + 1;
        }
      }
      pPrior._4_4_ = pPrior._4_4_ + 1;
    }
  }
  zP4 = (int *)sqlite3DbMallocRawNN(db_00,(long)(aPermute._4_4_ + 1) << 2);
  if (zP4 == (int *)0x0) {
    db = (sqlite3 *)0x0;
  }
  else {
    *zP4 = aPermute._4_4_;
    pEStack_128 = pEStack_100->a;
    for (pPrior._4_4_ = 1; (int)pPrior._4_4_ <= aPermute._4_4_; pPrior._4_4_ = pPrior._4_4_ + 1) {
      zP4[(int)pPrior._4_4_] = (pEStack_128->u).x.iOrderByCol - 1;
      pEStack_128 = pEStack_128 + 1;
    }
    db = (sqlite3 *)multiSelectOrderByKeyInfo(pParse,p,1);
  }
  p->pOrderBy = pEStack_100;
  pEVar6 = sqlite3ExprListDup(pParse->db,pEStack_100,0);
  pSelect->pOrderBy = pEVar6;
  if (uVar1 == 0x80) {
    savedOffset = 0;
  }
  else {
    iVar5 = p->pEList->nExpr;
    savedOffset = pParse->nMem + 1;
    pParse->nMem = iVar5 + 1 + pParse->nMem;
    sqlite3VdbeAddOp2(p_00,0x46,0,savedOffset);
    pKeyMerge = sqlite3KeyInfoAlloc(db_00,iVar5,1);
    if (pKeyMerge != (KeyInfo *)0x0) {
      for (pPrior._4_4_ = 0; (int)pPrior._4_4_ < iVar5; pPrior._4_4_ = pPrior._4_4_ + 1) {
        pCVar7 = multiSelectCollSeq(pParse,p,pPrior._4_4_);
        pKeyMerge->aColl[(int)pPrior._4_4_] = pCVar7;
        pKeyMerge->aSortOrder[(int)pPrior._4_4_] = '\0';
      }
    }
  }
  p->pPrior = (Select *)0x0;
  pSelect->pNext = (Select *)0x0;
  sqlite3ResolveOrderGroupBy(pParse,p,p->pOrderBy,"ORDER");
  if (pSelect->pPrior == (Select *)0x0) {
    sqlite3ResolveOrderGroupBy(pParse,pSelect,pSelect->pOrderBy,"ORDER");
  }
  computeLimitRegisters(pParse,p,iBreak);
  if ((p->iLimit == 0) || (uVar1 != 0x80)) {
    savedLimit = 0;
    regPrev = 0;
  }
  else {
    regPrev = pParse->nMem + 1;
    pParse->nMem = regPrev;
    savedLimit = pParse->nMem + 1;
    pParse->nMem = savedLimit;
    if (p->iOffset == 0) {
      local_13c = p->iLimit;
    }
    else {
      local_13c = p->iOffset + 1;
    }
    sqlite3VdbeAddOp2(p_00,0x4e,local_13c,regPrev);
    sqlite3VdbeAddOp2(p_00,0x4e,regPrev,savedLimit);
  }
  sqlite3ExprDelete(db_00,p->pLimit);
  p->pLimit = (Expr *)0x0;
  iParm = pParse->nMem + 1;
  pParse->nMem = iParm;
  iParm_00 = pParse->nMem + 1;
  pParse->nMem = iParm_00;
  regReturn = pParse->nMem + 1;
  pParse->nMem = regReturn;
  regReturn_00 = pParse->nMem + 1;
  pParse->nMem = regReturn_00;
  sqlite3SelectDestInit((SelectDest *)&destB.pOrderBy,0xd,iParm);
  sqlite3SelectDestInit((SelectDest *)&regAddrB,0xd,iParm_00);
  selectOpName((uint)p->op);
  sqlite3VdbeExplain(pParse,'\x01',"MERGE (%s)");
  iVar5 = sqlite3VdbeCurrentAddr(p_00);
  iVar5 = sqlite3VdbeAddOp3(p_00,0xd,iParm,0,iVar5 + 1);
  pSelect->iLimit = regPrev;
  sqlite3VdbeExplain(pParse,'\x01',"LEFT");
  sqlite3Select(pParse,pSelect,(SelectDest *)&destB.pOrderBy);
  sqlite3VdbeEndCoroutine(p_00,iParm);
  sqlite3VdbeJumpHere(p_00,iVar5);
  iVar5 = sqlite3VdbeCurrentAddr(p_00);
  addr = sqlite3VdbeAddOp3(p_00,0xd,iParm_00,0,iVar5 + 1);
  iVar5 = p->iLimit;
  iVar2 = p->iOffset;
  p->iLimit = savedLimit;
  p->iOffset = 0;
  sqlite3VdbeExplain(pParse,'\x01',"RIGHT");
  sqlite3Select(pParse,p,(SelectDest *)&regAddrB);
  p->iLimit = iVar5;
  p->iOffset = iVar2;
  sqlite3VdbeEndCoroutine(p_00,iParm_00);
  iVar5 = generateOutputSubroutine
                    (pParse,p,(SelectDest *)&destB.pOrderBy,pDest,regReturn,savedOffset,pKeyMerge,
                     iBreak);
  if ((uVar1 == 0x80) || (uVar1 == '\x7f')) {
    addrEofA_noB = generateOutputSubroutine
                             (pParse,p,(SelectDest *)&regAddrB,pDest,regReturn_00,savedOffset,
                              pKeyMerge,iBreak);
  }
  sqlite3KeyInfoUnref(pKeyMerge);
  addrAltB = iBreak;
  addrEofB = iBreak;
  if ((uVar1 != 0x81) && (uVar1 != 0x82)) {
    addrEofB = sqlite3VdbeAddOp2(p_00,0xc,regReturn_00,addrEofA_noB);
    addrAltB = sqlite3VdbeAddOp2(p_00,0xe,iParm_00,iBreak);
    sqlite3VdbeGoto(p_00,addrEofB);
    LVar4 = sqlite3LogEstAdd(p->nSelectRow,pSelect->nSelectRow);
    p->nSelectRow = LVar4;
  }
  if (uVar1 == 0x82) {
    addrAeqB = addrEofB;
    if (pSelect->nSelectRow < p->nSelectRow) {
      p->nSelectRow = pSelect->nSelectRow;
    }
  }
  else {
    addrAeqB = sqlite3VdbeAddOp2(p_00,0xc,regReturn,iVar5);
    sqlite3VdbeAddOp2(p_00,0xe,iParm,iBreak);
    sqlite3VdbeGoto(p_00,addrAeqB);
  }
  addrAgtB = sqlite3VdbeAddOp2(p_00,0xc,regReturn,iVar5);
  sqlite3VdbeAddOp2(p_00,0xe,iParm,addrEofB);
  sqlite3VdbeGoto(p_00,iDest);
  regLimitA = addrAgtB;
  if (uVar1 != 0x80) {
    if (uVar1 == 0x82) {
      addrAgtB = addrAgtB + 1;
    }
    else {
      regLimitA = sqlite3VdbeAddOp2(p_00,0xe,iParm,addrEofB);
      sqlite3VdbeGoto(p_00,iDest);
    }
  }
  iVar5 = sqlite3VdbeCurrentAddr(p_00);
  if ((uVar1 == 0x80) || (uVar1 == '\x7f')) {
    sqlite3VdbeAddOp2(p_00,0xc,regReturn_00,addrEofA_noB);
  }
  sqlite3VdbeAddOp2(p_00,0xe,iParm_00,addrAeqB);
  sqlite3VdbeGoto(p_00,iDest);
  sqlite3VdbeJumpHere(p_00,addr);
  sqlite3VdbeAddOp2(p_00,0xe,iParm,addrAltB);
  sqlite3VdbeAddOp2(p_00,0xe,iParm_00,addrAeqB);
  sqlite3VdbeResolveLabel(p_00,iDest);
  sqlite3VdbeAddOp4(p_00,0x56,0,0,0,(char *)zP4,-0xf);
  sqlite3VdbeAddOp4(p_00,0x57,destA._0_4_,destB._0_4_,aPermute._4_4_,(char *)db,-9);
  sqlite3VdbeChangeP5(p_00,1);
  sqlite3VdbeAddOp3(p_00,0x10,addrAgtB,regLimitA,iVar5);
  sqlite3VdbeResolveLabel(p_00,iBreak);
  if (p->pPrior != (Select *)0x0) {
    sqlite3SelectDelete(db_00,p->pPrior);
  }
  p->pPrior = pSelect;
  pSelect->pNext = p;
  sqlite3VdbeExplainPop(pParse);
  return (uint)(pParse->nErr != 0);
}

Assistant:

static int multiSelectOrderBy(
  Parse *pParse,        /* Parsing context */
  Select *p,            /* The right-most of SELECTs to be coded */
  SelectDest *pDest     /* What to do with query results */
){
  int i, j;             /* Loop counters */
  Select *pPrior;       /* Another SELECT immediately to our left */
  Vdbe *v;              /* Generate code to this VDBE */
  SelectDest destA;     /* Destination for coroutine A */
  SelectDest destB;     /* Destination for coroutine B */
  int regAddrA;         /* Address register for select-A coroutine */
  int regAddrB;         /* Address register for select-B coroutine */
  int addrSelectA;      /* Address of the select-A coroutine */
  int addrSelectB;      /* Address of the select-B coroutine */
  int regOutA;          /* Address register for the output-A subroutine */
  int regOutB;          /* Address register for the output-B subroutine */
  int addrOutA;         /* Address of the output-A subroutine */
  int addrOutB = 0;     /* Address of the output-B subroutine */
  int addrEofA;         /* Address of the select-A-exhausted subroutine */
  int addrEofA_noB;     /* Alternate addrEofA if B is uninitialized */
  int addrEofB;         /* Address of the select-B-exhausted subroutine */
  int addrAltB;         /* Address of the A<B subroutine */
  int addrAeqB;         /* Address of the A==B subroutine */
  int addrAgtB;         /* Address of the A>B subroutine */
  int regLimitA;        /* Limit register for select-A */
  int regLimitB;        /* Limit register for select-A */
  int regPrev;          /* A range of registers to hold previous output */
  int savedLimit;       /* Saved value of p->iLimit */
  int savedOffset;      /* Saved value of p->iOffset */
  int labelCmpr;        /* Label for the start of the merge algorithm */
  int labelEnd;         /* Label for the end of the overall SELECT stmt */
  int addr1;            /* Jump instructions that get retargetted */
  int op;               /* One of TK_ALL, TK_UNION, TK_EXCEPT, TK_INTERSECT */
  KeyInfo *pKeyDup = 0; /* Comparison information for duplicate removal */
  KeyInfo *pKeyMerge;   /* Comparison information for merging rows */
  sqlite3 *db;          /* Database connection */
  ExprList *pOrderBy;   /* The ORDER BY clause */
  int nOrderBy;         /* Number of terms in the ORDER BY clause */
  int *aPermute;        /* Mapping from ORDER BY terms to result set columns */

  assert( p->pOrderBy!=0 );
  assert( pKeyDup==0 ); /* "Managed" code needs this.  Ticket #3382. */
  db = pParse->db;
  v = pParse->pVdbe;
  assert( v!=0 );       /* Already thrown the error if VDBE alloc failed */
  labelEnd = sqlite3VdbeMakeLabel(pParse);
  labelCmpr = sqlite3VdbeMakeLabel(pParse);


  /* Patch up the ORDER BY clause
  */
  op = p->op;  
  pPrior = p->pPrior;
  assert( pPrior->pOrderBy==0 );
  pOrderBy = p->pOrderBy;
  assert( pOrderBy );
  nOrderBy = pOrderBy->nExpr;

  /* For operators other than UNION ALL we have to make sure that
  ** the ORDER BY clause covers every term of the result set.  Add
  ** terms to the ORDER BY clause as necessary.
  */
  if( op!=TK_ALL ){
    for(i=1; db->mallocFailed==0 && i<=p->pEList->nExpr; i++){
      struct ExprList_item *pItem;
      for(j=0, pItem=pOrderBy->a; j<nOrderBy; j++, pItem++){
        assert( pItem->u.x.iOrderByCol>0 );
        if( pItem->u.x.iOrderByCol==i ) break;
      }
      if( j==nOrderBy ){
        Expr *pNew = sqlite3Expr(db, TK_INTEGER, 0);
        if( pNew==0 ) return SQLITE_NOMEM_BKPT;
        pNew->flags |= EP_IntValue;
        pNew->u.iValue = i;
        p->pOrderBy = pOrderBy = sqlite3ExprListAppend(pParse, pOrderBy, pNew);
        if( pOrderBy ) pOrderBy->a[nOrderBy++].u.x.iOrderByCol = (u16)i;
      }
    }
  }

  /* Compute the comparison permutation and keyinfo that is used with
  ** the permutation used to determine if the next
  ** row of results comes from selectA or selectB.  Also add explicit
  ** collations to the ORDER BY clause terms so that when the subqueries
  ** to the right and the left are evaluated, they use the correct
  ** collation.
  */
  aPermute = sqlite3DbMallocRawNN(db, sizeof(int)*(nOrderBy + 1));
  if( aPermute ){
    struct ExprList_item *pItem;
    aPermute[0] = nOrderBy;
    for(i=1, pItem=pOrderBy->a; i<=nOrderBy; i++, pItem++){
      assert( pItem->u.x.iOrderByCol>0 );
      assert( pItem->u.x.iOrderByCol<=p->pEList->nExpr );
      aPermute[i] = pItem->u.x.iOrderByCol - 1;
    }
    pKeyMerge = multiSelectOrderByKeyInfo(pParse, p, 1);
  }else{
    pKeyMerge = 0;
  }

  /* Reattach the ORDER BY clause to the query.
  */
  p->pOrderBy = pOrderBy;
  pPrior->pOrderBy = sqlite3ExprListDup(pParse->db, pOrderBy, 0);

  /* Allocate a range of temporary registers and the KeyInfo needed
  ** for the logic that removes duplicate result rows when the
  ** operator is UNION, EXCEPT, or INTERSECT (but not UNION ALL).
  */
  if( op==TK_ALL ){
    regPrev = 0;
  }else{
    int nExpr = p->pEList->nExpr;
    assert( nOrderBy>=nExpr || db->mallocFailed );
    regPrev = pParse->nMem+1;
    pParse->nMem += nExpr+1;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, regPrev);
    pKeyDup = sqlite3KeyInfoAlloc(db, nExpr, 1);
    if( pKeyDup ){
      assert( sqlite3KeyInfoIsWriteable(pKeyDup) );
      for(i=0; i<nExpr; i++){
        pKeyDup->aColl[i] = multiSelectCollSeq(pParse, p, i);
        pKeyDup->aSortOrder[i] = 0;
      }
    }
  }
 
  /* Separate the left and the right query from one another
  */
  p->pPrior = 0;
  pPrior->pNext = 0;
  sqlite3ResolveOrderGroupBy(pParse, p, p->pOrderBy, "ORDER");
  if( pPrior->pPrior==0 ){
    sqlite3ResolveOrderGroupBy(pParse, pPrior, pPrior->pOrderBy, "ORDER");
  }

  /* Compute the limit registers */
  computeLimitRegisters(pParse, p, labelEnd);
  if( p->iLimit && op==TK_ALL ){
    regLimitA = ++pParse->nMem;
    regLimitB = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Copy, p->iOffset ? p->iOffset+1 : p->iLimit,
                                  regLimitA);
    sqlite3VdbeAddOp2(v, OP_Copy, regLimitA, regLimitB);
  }else{
    regLimitA = regLimitB = 0;
  }
  sqlite3ExprDelete(db, p->pLimit);
  p->pLimit = 0;

  regAddrA = ++pParse->nMem;
  regAddrB = ++pParse->nMem;
  regOutA = ++pParse->nMem;
  regOutB = ++pParse->nMem;
  sqlite3SelectDestInit(&destA, SRT_Coroutine, regAddrA);
  sqlite3SelectDestInit(&destB, SRT_Coroutine, regAddrB);

  ExplainQueryPlan((pParse, 1, "MERGE (%s)", selectOpName(p->op)));

  /* Generate a coroutine to evaluate the SELECT statement to the
  ** left of the compound operator - the "A" select.
  */
  addrSelectA = sqlite3VdbeCurrentAddr(v) + 1;
  addr1 = sqlite3VdbeAddOp3(v, OP_InitCoroutine, regAddrA, 0, addrSelectA);
  VdbeComment((v, "left SELECT"));
  pPrior->iLimit = regLimitA;
  ExplainQueryPlan((pParse, 1, "LEFT"));
  sqlite3Select(pParse, pPrior, &destA);
  sqlite3VdbeEndCoroutine(v, regAddrA);
  sqlite3VdbeJumpHere(v, addr1);

  /* Generate a coroutine to evaluate the SELECT statement on 
  ** the right - the "B" select
  */
  addrSelectB = sqlite3VdbeCurrentAddr(v) + 1;
  addr1 = sqlite3VdbeAddOp3(v, OP_InitCoroutine, regAddrB, 0, addrSelectB);
  VdbeComment((v, "right SELECT"));
  savedLimit = p->iLimit;
  savedOffset = p->iOffset;
  p->iLimit = regLimitB;
  p->iOffset = 0;  
  ExplainQueryPlan((pParse, 1, "RIGHT"));
  sqlite3Select(pParse, p, &destB);
  p->iLimit = savedLimit;
  p->iOffset = savedOffset;
  sqlite3VdbeEndCoroutine(v, regAddrB);

  /* Generate a subroutine that outputs the current row of the A
  ** select as the next output row of the compound select.
  */
  VdbeNoopComment((v, "Output routine for A"));
  addrOutA = generateOutputSubroutine(pParse,
                 p, &destA, pDest, regOutA,
                 regPrev, pKeyDup, labelEnd);
  
  /* Generate a subroutine that outputs the current row of the B
  ** select as the next output row of the compound select.
  */
  if( op==TK_ALL || op==TK_UNION ){
    VdbeNoopComment((v, "Output routine for B"));
    addrOutB = generateOutputSubroutine(pParse,
                 p, &destB, pDest, regOutB,
                 regPrev, pKeyDup, labelEnd);
  }
  sqlite3KeyInfoUnref(pKeyDup);

  /* Generate a subroutine to run when the results from select A
  ** are exhausted and only data in select B remains.
  */
  if( op==TK_EXCEPT || op==TK_INTERSECT ){
    addrEofA_noB = addrEofA = labelEnd;
  }else{  
    VdbeNoopComment((v, "eof-A subroutine"));
    addrEofA = sqlite3VdbeAddOp2(v, OP_Gosub, regOutB, addrOutB);
    addrEofA_noB = sqlite3VdbeAddOp2(v, OP_Yield, regAddrB, labelEnd);
                                     VdbeCoverage(v);
    sqlite3VdbeGoto(v, addrEofA);
    p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
  }

  /* Generate a subroutine to run when the results from select B
  ** are exhausted and only data in select A remains.
  */
  if( op==TK_INTERSECT ){
    addrEofB = addrEofA;
    if( p->nSelectRow > pPrior->nSelectRow ) p->nSelectRow = pPrior->nSelectRow;
  }else{  
    VdbeNoopComment((v, "eof-B subroutine"));
    addrEofB = sqlite3VdbeAddOp2(v, OP_Gosub, regOutA, addrOutA);
    sqlite3VdbeAddOp2(v, OP_Yield, regAddrA, labelEnd); VdbeCoverage(v);
    sqlite3VdbeGoto(v, addrEofB);
  }

  /* Generate code to handle the case of A<B
  */
  VdbeNoopComment((v, "A-lt-B subroutine"));
  addrAltB = sqlite3VdbeAddOp2(v, OP_Gosub, regOutA, addrOutA);
  sqlite3VdbeAddOp2(v, OP_Yield, regAddrA, addrEofA); VdbeCoverage(v);
  sqlite3VdbeGoto(v, labelCmpr);

  /* Generate code to handle the case of A==B
  */
  if( op==TK_ALL ){
    addrAeqB = addrAltB;
  }else if( op==TK_INTERSECT ){
    addrAeqB = addrAltB;
    addrAltB++;
  }else{
    VdbeNoopComment((v, "A-eq-B subroutine"));
    addrAeqB =
    sqlite3VdbeAddOp2(v, OP_Yield, regAddrA, addrEofA); VdbeCoverage(v);
    sqlite3VdbeGoto(v, labelCmpr);
  }

  /* Generate code to handle the case of A>B
  */
  VdbeNoopComment((v, "A-gt-B subroutine"));
  addrAgtB = sqlite3VdbeCurrentAddr(v);
  if( op==TK_ALL || op==TK_UNION ){
    sqlite3VdbeAddOp2(v, OP_Gosub, regOutB, addrOutB);
  }
  sqlite3VdbeAddOp2(v, OP_Yield, regAddrB, addrEofB); VdbeCoverage(v);
  sqlite3VdbeGoto(v, labelCmpr);

  /* This code runs once to initialize everything.
  */
  sqlite3VdbeJumpHere(v, addr1);
  sqlite3VdbeAddOp2(v, OP_Yield, regAddrA, addrEofA_noB); VdbeCoverage(v);
  sqlite3VdbeAddOp2(v, OP_Yield, regAddrB, addrEofB); VdbeCoverage(v);

  /* Implement the main merge loop
  */
  sqlite3VdbeResolveLabel(v, labelCmpr);
  sqlite3VdbeAddOp4(v, OP_Permutation, 0, 0, 0, (char*)aPermute, P4_INTARRAY);
  sqlite3VdbeAddOp4(v, OP_Compare, destA.iSdst, destB.iSdst, nOrderBy,
                         (char*)pKeyMerge, P4_KEYINFO);
  sqlite3VdbeChangeP5(v, OPFLAG_PERMUTE);
  sqlite3VdbeAddOp3(v, OP_Jump, addrAltB, addrAeqB, addrAgtB); VdbeCoverage(v);

  /* Jump to the this point in order to terminate the query.
  */
  sqlite3VdbeResolveLabel(v, labelEnd);

  /* Reassembly the compound query so that it will be freed correctly
  ** by the calling function */
  if( p->pPrior ){
    sqlite3SelectDelete(db, p->pPrior);
  }
  p->pPrior = pPrior;
  pPrior->pNext = p;

  /*** TBD:  Insert subroutine calls to close cursors on incomplete
  **** subqueries ****/
  ExplainQueryPlanPop(pParse);
  return pParse->nErr!=0;
}